

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::detail::
index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  supertype *psVar1;
  type_conflict9 tVar2;
  bool bVar3;
  int extraout_EAX;
  fd_set *pfVar4;
  unsigned_long i;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
  *this_00;
  uint in_stack_00000008;
  value_type j;
  string_view_type sv;
  error_code ec;
  undefined4 uVar7;
  path_node_type *local_80;
  undefined1 local_70 [16];
  string_view_type local_60;
  string_view_type local_50;
  int local_40 [2];
  undefined8 local_38;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
             *)CONCAT44(in_register_00000034,__nfds);
  uVar7 = (undefined4)((ulong)local_40 >> 0x20);
  local_40[0] = 0;
  local_38 = std::_V2::system_category();
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate((token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)local_70,
             (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&this->expr_,(reference)this_00,(reference)__readfds,(result_options)__exceptfds,
             (error_code *)(ulong)in_stack_00000008);
  if (local_40[0] == 0) {
    tVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            is_integer<unsigned_long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_70)
    ;
    pfVar4 = __exceptfds;
    if (tVar2) {
      while (uVar6 = (byte)pfVar4->fds_bits[0] & 0xf, uVar6 - 8 < 2) {
        pfVar4 = (fd_set *)pfVar4->fds_bits[1];
      }
      if (uVar6 == 0xe) {
        i = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            as_integer<unsigned_long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_70)
        ;
        local_60._M_len = i;
        local_80 = (path_node_type *)__writefds;
        if ((in_stack_00000008 & 0xb) != 0) {
          local_50._M_len = (size_t)__writefds;
          local_80 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                               (this_00,(basic_path_node<char> **)&local_50,&local_60._M_len);
        }
        pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            __exceptfds,i);
        psVar1 = (this->
                 super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ).tail_;
        if (psVar1 == (supertype *)0x0) {
          (**(code **)(__timeout->tv_sec + 0x10))(__timeout,local_80,pbVar5);
        }
        else {
          (*psVar1->_vptr_jsonpath_selector[2])
                    (psVar1,this_00,__readfds,local_80,pbVar5,__timeout,
                     CONCAT44(uVar7,in_stack_00000008));
        }
        goto LAB_003ca9f1;
      }
    }
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_70)
    ;
    if ((bVar3) &&
       (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds), bVar3)) {
      local_60 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            local_70);
      if ((in_stack_00000008 & 0xb) != 0) {
        local_50._M_len = (size_t)__writefds;
        __writefds = (fd_set *)
                     eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,std::basic_string_view<char,std::char_traits<char>>const&>
                               (this_00,(basic_path_node<char> **)&local_50,&local_60);
      }
      local_50 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            local_70);
      pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          __exceptfds,&local_50);
      psVar1 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar1 == (supertype *)0x0) {
        (**(code **)(__timeout->tv_sec + 0x10))(__timeout,__writefds,pbVar5);
      }
      else {
        (*psVar1->_vptr_jsonpath_selector[2])
                  (psVar1,this_00,__readfds,__writefds,pbVar5,__timeout,
                   CONCAT44(uVar7,in_stack_00000008));
      }
    }
  }
LAB_003ca9f1:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_70);
  return extraout_EAX;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            std::error_code ec;
            value_type j = expr_.evaluate(context, root, current, options, ec);

            if (!ec)
            {
                if (j.template is<std::size_t>() && current.is_array())
                {
                    std::size_t start = j.template as<std::size_t>();
                    this->tail_select(context, root, 
                                      path_generator_type::generate(context, last, start, options),
                                      current.at(start), receiver, options);
                }
                else if (j.is_string() && current.is_object())
                {
                    auto sv = j.as_string_view();
                    this->tail_select(context, root, 
                                      path_generator_type::generate(context, last, sv, options),
                                      current.at(j.as_string_view()), receiver, options);
                }
            }
        }